

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O2

Lhs * __thiscall
Lib::
SkipList<Inferences::ALASCA::FourierMotzkinConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::LDComparator>
::pop(Lhs *__return_storage_ptr__,
     SkipList<Inferences::ALASCA::FourierMotzkinConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::LDComparator>
     *this)

{
  uint uVar1;
  Clause *node;
  Node *pNVar2;
  uint uVar3;
  ulong uVar4;
  SelectedSummand local_50;
  
  node = (Clause *)this->_left->nodes[0];
  uVar1 = this->_top;
  uVar3 = 1;
  if (1 < uVar1) {
    uVar3 = uVar1;
  }
  pNVar2 = this->_left + 1;
  uVar4 = 1;
  do {
    if (uVar1 <= uVar4) {
LAB_002b42bf:
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        this->_left->nodes[uVar4] = (Node *)node->_literals[uVar4 + 0xfffffffffffffff8];
      }
      Kernel::SelectedSummand::SelectedSummand(&local_50,(SelectedSummand *)node);
      Kernel::SelectedSummand::SelectedSummand
                (&__return_storage_ptr__->super_SelectedSummand,&local_50);
      deallocate((Node *)node,uVar3 - 1);
      return __return_storage_ptr__;
    }
    if ((pNVar2->value).super_SelectedSummand.super_SelectedLiteral.cl != node) {
      uVar3 = (uint)uVar4;
      goto LAB_002b42bf;
    }
    uVar4 = uVar4 + 1;
    pNVar2 = (Node *)&(pNVar2->value).super_SelectedSummand.super_SelectedLiteral.litIdx;
  } while( true );
}

Assistant:

Value pop()
  {
    ASS(isNonEmpty());

    // find the height of the first
    Node* node = _left->nodes[0];
    unsigned h;
    for (h = 1;h < _top;h++) {
      if (_left->nodes[h] != node) {
	break;
      }
    }
    // the height of the first node is h-1
    for (unsigned i = 0;i < h;i++) {
      _left->nodes[i] = node->nodes[i];
    }
    Value val = node->value;
    deallocate(node,h-1);
    return val;
  }